

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_eof(LIBSSH2_CHANNEL *channel)

{
  uint32_t uVar1;
  uint32_t uVar2;
  LIBSSH2_PACKET *pLVar3;
  LIBSSH2_PACKET *next_packet;
  LIBSSH2_PACKET *packet;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    pLVar3 = (LIBSSH2_PACKET *)_libssh2_list_first(&channel->session->packets);
    do {
      next_packet = pLVar3;
      if (next_packet == (LIBSSH2_PACKET *)0x0) {
        return (int)(channel->remote).eof;
      }
      pLVar3 = (LIBSSH2_PACKET *)_libssh2_list_next(&next_packet->node);
    } while (((next_packet->data_len == 0) ||
             (((*next_packet->data != '^' && (*next_packet->data != '_')) ||
              (next_packet->data_len < 5)))) ||
            (uVar1 = (channel->local).id, uVar2 = _libssh2_ntohu32(next_packet->data + 1),
            uVar1 != uVar2));
    channel_local._4_4_ = 0;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_eof(LIBSSH2_CHANNEL * channel)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;
    LIBSSH2_PACKET *next_packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while(packet) {

        next_packet = _libssh2_list_next(&packet->node);

        if(packet->data_len < 1) {
            packet = next_packet;
            _libssh2_debug((channel->session, LIBSSH2_TRACE_ERROR,
                           "Unexpected packet length"));
            continue;
        }

        if(((packet->data[0] == SSH_MSG_CHANNEL_DATA)
            || (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA))
            && ((packet->data_len >= 5)
            && (channel->local.id == _libssh2_ntohu32(packet->data + 1)))) {
            /* There's data waiting to be read yet, mask the EOF status */
            return 0;
        }
        packet = next_packet;
    }

    return channel->remote.eof;
}